

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

WriteBatch * __thiscall leveldb::DBImpl::BuildBatchGroup(DBImpl *this,Writer **last_writer)

{
  value_type pWVar1;
  Writer *pWVar2;
  bool bVar3;
  int iVar4;
  reference ppWVar5;
  reference ppWVar6;
  size_t sVar7;
  Writer *w;
  undefined1 local_58 [8];
  iterator iter;
  size_t max_size;
  size_t size;
  WriteBatch *result;
  Writer *first;
  Writer **last_writer_local;
  DBImpl *this_local;
  
  port::Mutex::AssertHeld(&this->mutex_);
  bVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::empty
                    (&this->writers_);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!writers_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x505,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
  }
  ppWVar5 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::front
                      (&this->writers_);
  pWVar1 = *ppWVar5;
  size = (size_t)pWVar1->batch;
  if ((WriteBatch *)size != (WriteBatch *)0x0) {
    max_size = WriteBatchInternal::ByteSize(pWVar1->batch);
    iter._M_node = (_Map_pointer)
                   &std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>;
    if (max_size < 0x20001) {
      iter._M_node = (_Map_pointer)(max_size + 0x20000);
    }
    *last_writer = pWVar1;
    std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::begin
              ((iterator *)local_58,&this->writers_);
    std::
    _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
    ::operator++((_Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
                  *)local_58);
    while( true ) {
      std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::end
                ((iterator *)&w,&this->writers_);
      bVar3 = std::operator!=((_Self *)local_58,(_Self *)&w);
      if (!bVar3) {
        return (WriteBatch *)size;
      }
      ppWVar6 = std::
                _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
                ::operator*((_Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
                             *)local_58);
      pWVar2 = *ppWVar6;
      if (((pWVar2->sync & 1U) != 0) && ((pWVar1->sync & 1U) == 0)) break;
      if (pWVar2->batch != (WriteBatch *)0x0) {
        sVar7 = WriteBatchInternal::ByteSize(pWVar2->batch);
        max_size = sVar7 + max_size;
        if (iter._M_node < max_size) {
          return (WriteBatch *)size;
        }
        if ((WriteBatch *)size == pWVar1->batch) {
          size = (size_t)this->tmp_batch_;
          iVar4 = WriteBatchInternal::Count((WriteBatch *)size);
          if (iVar4 != 0) {
            __assert_fail("WriteBatchInternal::Count(result) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                          ,0x529,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
          }
          WriteBatchInternal::Append((WriteBatch *)size,pWVar1->batch);
        }
        WriteBatchInternal::Append((WriteBatch *)size,pWVar2->batch);
      }
      *last_writer = pWVar2;
      std::
      _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
      ::operator++((_Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
                    *)local_58);
    }
    return (WriteBatch *)size;
  }
  __assert_fail("result != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                ,0x508,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
}

Assistant:

WriteBatch* DBImpl::BuildBatchGroup(Writer** last_writer) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  Writer* first = writers_.front();
  WriteBatch* result = first->batch;
  assert(result != nullptr);

  size_t size = WriteBatchInternal::ByteSize(first->batch);

  // Allow the group to grow up to a maximum size, but if the
  // original write is small, limit the growth so we do not slow
  // down the small write too much.
  size_t max_size = 1 << 20;
  if (size <= (128 << 10)) {
    max_size = size + (128 << 10);
  }

  *last_writer = first;
  std::deque<Writer*>::iterator iter = writers_.begin();
  ++iter;  // Advance past "first"
  for (; iter != writers_.end(); ++iter) {
    Writer* w = *iter;
    if (w->sync && !first->sync) {
      // Do not include a sync write into a batch handled by a non-sync write.
      break;
    }

    if (w->batch != nullptr) {
      size += WriteBatchInternal::ByteSize(w->batch);
      if (size > max_size) {
        // Do not make batch too big
        break;
      }

      // Append to *result
      if (result == first->batch) {
        // Switch to temporary batch instead of disturbing caller's batch
        result = tmp_batch_;
        assert(WriteBatchInternal::Count(result) == 0);
        WriteBatchInternal::Append(result, first->batch);
      }
      WriteBatchInternal::Append(result, w->batch);
    }
    *last_writer = w;
  }
  return result;
}